

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::VaryingComponentsTest::getProgramInterface
          (VaryingComponentsTest *this,GLuint test_case_index,ProgramInterface *program_interface,
          VaryingPassthrough *varying_passthrough)

{
  ShaderInterface *pSVar1;
  size_type __n;
  reference pvVar2;
  const_reference __src;
  uint local_12c;
  GLuint i;
  GLubyte *src;
  GLubyte *dst;
  size_t data_size;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_100;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_e8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *data;
  ShaderInterface si;
  TYPES local_50;
  undefined1 local_44 [8];
  Type vector_type;
  testCase *test_case;
  GLuint array_length;
  VaryingPassthrough *varying_passthrough_local;
  ProgramInterface *program_interface_local;
  GLuint test_case_index_local;
  VaryingComponentsTest *this_local;
  
  test_case._4_4_ =
       (**(code **)((long)(this->super_VaryingLocationsTest).super_TextureTestBase.super_TestBase.
                          super_TestCase.super_TestCase.super_TestNode._vptr_TestNode + 0x110))();
  vector_type._4_8_ =
       std::
       vector<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase,_std::allocator<gl4cts::EnhancedLayouts::VaryingComponentsTest::testCase>_>
       ::operator[](&this->m_test_cases,(ulong)test_case_index);
  join_0x00000010_0x00000000_ = Utils::Type::GetType(((reference)vector_type._4_8_)->m_type,1,4);
  local_44 = (undefined1  [8])si._128_8_;
  vector_type.m_basic_type = local_50;
  pSVar1 = Utils::ProgramInterface::GetShaderInterface(program_interface,VERTEX);
  Utils::ShaderInterface::ShaderInterface((ShaderInterface *)&data,pSVar1);
  if (test_case._4_4_ == 0) {
    test_case._4_4_ = 1;
  }
  Utils::Type::GenerateDataPacked(&local_100,(Type *)local_44);
  local_e8 = &local_100;
  __n = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(local_e8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_data,test_case._4_4_ * __n);
  pvVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](&this->m_data,0);
  __src = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[](local_e8,0);
  for (local_12c = 0; local_12c < test_case._4_4_; local_12c = local_12c + 1) {
    memcpy(pvVar2 + __n * local_12c,__src,__n);
  }
  prepareShaderStage(this,FRAGMENT,(Type *)local_44,program_interface,(testCase *)vector_type._4_8_,
                     varying_passthrough);
  prepareShaderStage(this,GEOMETRY,(Type *)local_44,program_interface,(testCase *)vector_type._4_8_,
                     varying_passthrough);
  prepareShaderStage(this,TESS_CTRL,(Type *)local_44,program_interface,(testCase *)vector_type._4_8_
                     ,varying_passthrough);
  prepareShaderStage(this,TESS_EVAL,(Type *)local_44,program_interface,(testCase *)vector_type._4_8_
                     ,varying_passthrough);
  prepareShaderStage(this,VERTEX,(Type *)local_44,program_interface,(testCase *)vector_type._4_8_,
                     varying_passthrough);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_100);
  Utils::ShaderInterface::~ShaderInterface((ShaderInterface *)&data);
  return;
}

Assistant:

void VaryingComponentsTest::getProgramInterface(GLuint test_case_index, Utils::ProgramInterface& program_interface,
												Utils::VaryingPassthrough& varying_passthrough)
{
	GLuint				   array_length = getArrayLength();
	const testCase&		   test_case	= m_test_cases[test_case_index];
	const Utils::Type	  vector_type  = Utils::Type::GetType(test_case.m_type, 1, 4);
	Utils::ShaderInterface si			= program_interface.GetShaderInterface(Utils::Shader::VERTEX);

	/* Zero means no array, however we still need at least 1 slot of data */
	if (0 == array_length)
	{
		array_length += 1;
	}

	/* Generate data */
	const std::vector<GLubyte>& data	  = vector_type.GenerateDataPacked();
	const size_t				data_size = data.size();

	/* Prepare data for variables */
	m_data.resize(array_length * data_size);

	GLubyte*	   dst = &m_data[0];
	const GLubyte* src = &data[0];

	for (GLuint i = 0; i < array_length; ++i)
	{
		memcpy(dst + data_size * i, src, data_size);
	}

	/* Prepare interface for each stage */
	prepareShaderStage(Utils::Shader::FRAGMENT, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::GEOMETRY, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_CTRL, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::TESS_EVAL, vector_type, program_interface, test_case, varying_passthrough);
	prepareShaderStage(Utils::Shader::VERTEX, vector_type, program_interface, test_case, varying_passthrough);
}